

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O2

var __thiscall cs::runtime_type::parse_divasi(runtime_type *this,var *a,var *b)

{
  parse_div((runtime_type *)&stack0xffffffffffffffe0,a,b);
  cs_impl::any::swap(b,(any *)&stack0xffffffffffffffe0,true);
  cs_impl::any::recycle((any *)&stack0xffffffffffffffe0);
  (this->literals).
  super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
  .
  super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
  .ctrl_ = &b->mDat->is_rvalue;
  b->mDat = (proxy *)0x0;
  return (var)(proxy *)this;
}

Assistant:

var runtime_type::parse_divasi(var a, const var &b)
	{
		a.swap(parse_div(a, b), true);
		return a;
	}